

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_service_server
          (t_netstd_generator *this,ostream *out,t_service *tservice)

{
  int *piVar1;
  ostream *poVar2;
  t_service *extraout_RDX;
  t_service *tservice_00;
  t_service *extraout_RDX_00;
  pointer pptVar3;
  string raw_func_name;
  string local_170;
  string local_150;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_110;
  string extends;
  string extends_processor;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  std::__cxx11::string::string((string *)&extends,"",(allocator *)&extends_processor);
  std::__cxx11::string::string((string *)&extends_processor,"",(allocator *)&raw_func_name);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&raw_func_name,this,&tservice->extends_->super_t_type,true);
    std::__cxx11::string::operator=((string *)&extends,(string *)&raw_func_name);
    std::__cxx11::string::~string((string *)&raw_func_name);
    std::operator+(&raw_func_name,&extends,".AsyncProcessor, ");
    std::__cxx11::string::operator=((string *)&extends_processor,(string *)&raw_func_name);
    std::__cxx11::string::~string((string *)&raw_func_name);
  }
  prepare_member_name_mapping(this,tservice);
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"public class AsyncProcessor : ");
  poVar2 = std::operator<<(poVar2,(string *)&extends_processor);
  poVar2 = std::operator<<(poVar2,"ITAsyncProcessor");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&raw_func_name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"private readonly IAsync _iAsync;");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  poVar2 = std::operator<<(poVar2,"private readonly ILogger<AsyncProcessor> _logger;");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_150);
  std::operator<<(poVar2,
                  "public AsyncProcessor(IAsync iAsync, ILogger<AsyncProcessor> logger = default)");
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&raw_func_name);
  if (extends._M_string_length != 0) {
    std::operator<<(out," : base(iAsync)");
  }
  poVar2 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&raw_func_name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,
                           "_iAsync = iAsync ?? throw new ArgumentNullException(nameof(iAsync));");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&raw_func_name);
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"_logger = logger;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&raw_func_name);
  for (pptVar3 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar3 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    std::__cxx11::string::string((string *)&raw_func_name,(string *)&(*pptVar3)->name_);
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&local_170);
    poVar2 = std::operator<<(poVar2,"processMap_[\"");
    poVar2 = std::operator<<(poVar2,(string *)&raw_func_name);
    poVar2 = std::operator<<(poVar2,"\"] = ");
    poVar2 = std::operator<<(poVar2,(string *)&raw_func_name);
    poVar2 = std::operator<<(poVar2,"_ProcessAsync;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&raw_func_name);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&raw_func_name);
  if (extends._M_string_length == 0) {
    t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&raw_func_name);
    poVar2 = std::operator<<(poVar2,
                             "protected delegate global::System.Threading.Tasks.Task ProcessFunction(int seqid, TProtocol iprot, TProtocol oprot, CancellationToken "
                            );
    poVar2 = std::operator<<(poVar2,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,");");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&raw_func_name);
    if (extends._M_string_length == 0) {
      t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
      poVar2 = std::operator<<(out,(string *)&raw_func_name);
      poVar2 = std::operator<<(poVar2,
                               "protected Dictionary<string, ProcessFunction> processMap_ = new Dictionary<string, ProcessFunction>();"
                              );
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&raw_func_name);
    }
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  if (extends._M_string_length == 0) {
    t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&raw_func_name);
    poVar2 = std::operator<<(poVar2,
                             "public async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot)"
                            );
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    poVar2 = std::operator<<(poVar2,"{");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&raw_func_name);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&raw_func_name);
    poVar2 = std::operator<<(poVar2,
                             "return await ProcessAsync(iprot, oprot, CancellationToken.None);");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&raw_func_name);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&raw_func_name);
    poVar2 = std::operator<<(poVar2,"}");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&raw_func_name);
    t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&raw_func_name);
    poVar2 = std::operator<<(poVar2,
                             "public async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot, CancellationToken "
                            );
    poVar2 = std::operator<<(poVar2,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,")");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&raw_func_name);
    poVar2 = std::operator<<(poVar2,
                             "public new async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot)"
                            );
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    poVar2 = std::operator<<(poVar2,"{");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&raw_func_name);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&raw_func_name);
    poVar2 = std::operator<<(poVar2,
                             "return await ProcessAsync(iprot, oprot, CancellationToken.None);");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&raw_func_name);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&raw_func_name);
    poVar2 = std::operator<<(poVar2,"}");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&raw_func_name);
    t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&raw_func_name);
    poVar2 = std::operator<<(poVar2,
                             "public new async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot, CancellationToken "
                            );
    poVar2 = std::operator<<(poVar2,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,")");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&raw_func_name);
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&raw_func_name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"try");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&raw_func_name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"var msg = await iprot.ReadMessageBeginAsync(");
  poVar2 = std::operator<<(poVar2,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,");");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  poVar2 = std::operator<<(poVar2,"processMap_.TryGetValue(msg.Name, out ProcessFunction fn);");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_150);
  poVar2 = std::operator<<(poVar2,"if (fn == null)");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_110);
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&raw_func_name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"await TProtocolUtil.SkipAsync(iprot, TType.Struct, ");
  poVar2 = std::operator<<(poVar2,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,");");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  poVar2 = std::operator<<(poVar2,"await iprot.ReadMessageEndAsync(");
  poVar2 = std::operator<<(poVar2,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,");");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_150);
  poVar2 = std::operator<<(poVar2,
                           "var x = new TApplicationException (TApplicationException.ExceptionType.UnknownMethod, \"Invalid method name: \'\" + msg.Name + \"\'\");"
                          );
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_110);
  poVar2 = std::operator<<(poVar2,
                           "await oprot.WriteMessageBeginAsync(new TMessage(msg.Name, TMessageType.Exception, msg.SeqID), "
                          );
  poVar2 = std::operator<<(poVar2,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,");");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  poVar2 = std::operator<<(poVar2,"await x.WriteAsync(oprot, ");
  poVar2 = std::operator<<(poVar2,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,");");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  poVar2 = std::operator<<(poVar2,"await oprot.WriteMessageEndAsync(");
  poVar2 = std::operator<<(poVar2,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,");");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_90);
  poVar2 = std::operator<<(poVar2,"await oprot.Transport.FlushAsync(");
  poVar2 = std::operator<<(poVar2,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,");");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_b0);
  poVar2 = std::operator<<(poVar2,"return true;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&raw_func_name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  poVar2 = std::operator<<(poVar2,"await fn(msg.SeqID, iprot, oprot, ");
  poVar2 = std::operator<<(poVar2,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,");");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&raw_func_name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&raw_func_name);
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"catch (IOException)");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&raw_func_name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"return false;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&raw_func_name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  poVar2 = std::operator<<(poVar2,"return true;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&raw_func_name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&raw_func_name);
  tservice_00 = extraout_RDX;
  for (pptVar3 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar3 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    generate_process_function_async(this,out,tservice_00,*pptVar3);
    tservice_00 = extraout_RDX_00;
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&raw_func_name,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&raw_func_name);
  poVar2 = std::operator<<(poVar2,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&raw_func_name);
  cleanup_member_name_mapping(this,tservice);
  std::__cxx11::string::~string((string *)&extends_processor);
  std::__cxx11::string::~string((string *)&extends);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  return;
}

Assistant:

void t_netstd_generator::generate_service_server(ostream& out, t_service* tservice)
{
    vector<t_function*> functions = tservice->get_functions();
    vector<t_function*>::iterator f_iter;

    string extends = "";
    string extends_processor = "";
    if (tservice->get_extends() != nullptr)
    {
        extends = type_name(tservice->get_extends());
        extends_processor = extends + ".AsyncProcessor, ";
    }

    prepare_member_name_mapping(tservice);
    out << indent() << "public class AsyncProcessor : " << extends_processor << "ITAsyncProcessor" << endl
        << indent() << "{" << endl;

    indent_up();

    out << indent() << "private readonly IAsync _iAsync;" << endl
        << indent() << "private readonly ILogger<AsyncProcessor> _logger;" << endl
        << endl
        << indent() << "public AsyncProcessor(IAsync iAsync, ILogger<AsyncProcessor> logger = default)";

    if (!extends.empty())
    {
        out << " : base(iAsync)";
    }

    out << endl
        << indent() << "{" << endl;
    indent_up();

    out << indent() << "_iAsync = iAsync ?? throw new ArgumentNullException(nameof(iAsync));" << endl;
    out << indent() << "_logger = logger;" << endl;
    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter)
    {
        string raw_func_name = (*f_iter)->get_name();
        out << indent() << "processMap_[\"" << raw_func_name << "\"] = " << raw_func_name << "_ProcessAsync;" << endl;
    }

    indent_down();
    out << indent() << "}" << endl
        << endl;

    if (extends.empty())
    {
        out << indent() << "protected delegate global::System.Threading.Tasks.Task ProcessFunction(int seqid, TProtocol iprot, TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    if (extends.empty())
    {
        out << indent() << "protected Dictionary<string, ProcessFunction> processMap_ = new Dictionary<string, ProcessFunction>();" << endl;
    }

    out << endl;

    if (extends.empty())
    {
        out << indent() << "public async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot)" << endl
            << indent() << "{" << endl;
        indent_up();
        out << indent() << "return await ProcessAsync(iprot, oprot, CancellationToken.None);" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;

        out << indent() << "public async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl;
    }
    else
    {
        out << indent() << "public new async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot)" << endl
            << indent() << "{" << endl;
        indent_up();
        out << indent() << "return await ProcessAsync(iprot, oprot, CancellationToken.None);" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;

        out << indent() << "public new async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl;
    }

    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "var msg = await iprot.ReadMessageBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << endl
        << indent() << "processMap_.TryGetValue(msg.Name, out ProcessFunction fn);" << endl
        << endl
        << indent() << "if (fn == null)" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "await TProtocolUtil.SkipAsync(iprot, TType.Struct, " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await iprot.ReadMessageEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "var x = new TApplicationException (TApplicationException.ExceptionType.UnknownMethod, \"Invalid method name: '\" + msg.Name + \"'\");" << endl
        << indent() << "await oprot.WriteMessageBeginAsync(new TMessage(msg.Name, TMessageType.Exception, msg.SeqID), " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await x.WriteAsync(oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.WriteMessageEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.Transport.FlushAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "return true;" << endl;
    indent_down();
    out << indent() << "}" << endl
        << endl
        << indent() << "await fn(msg.SeqID, iprot, oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl
        << endl;
    indent_down();
    out << indent() << "}" << endl;
    out << indent() << "catch (IOException)" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "return false;" << endl;
    indent_down();
    out << indent() << "}" << endl
        << endl
        << indent() << "return true;" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter)
    {
        generate_process_function_async(out, tservice, *f_iter);
    }

    indent_down();
    out << indent() << "}" << endl << endl;
    cleanup_member_name_mapping(tservice);
}